

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

void getLpMatrixCoefficient(HighsLp *lp,HighsInt Xrow,HighsInt Xcol,double *val)

{
  uint uVar1;
  pointer piVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  double dVar6;
  
  piVar2 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = piVar2[Xcol];
  uVar1 = piVar2[(long)Xcol + 1];
  uVar3 = 0xffffffff;
  if ((int)uVar4 < (int)uVar1) {
    piVar5 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + (int)uVar4;
    do {
      uVar3 = uVar4;
      if (*piVar5 == Xrow) break;
      uVar4 = uVar4 + 1;
      piVar5 = piVar5 + 1;
      uVar3 = 0xffffffff;
    } while (uVar1 != uVar4);
  }
  if ((int)uVar3 < 0) {
    dVar6 = 0.0;
  }
  else {
    dVar6 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar3];
  }
  *val = dVar6;
  return;
}

Assistant:

void getLpMatrixCoefficient(const HighsLp& lp, const HighsInt Xrow,
                            const HighsInt Xcol, double* val) {
  assert(0 <= Xrow && Xrow < lp.num_row_);
  assert(0 <= Xcol && Xcol < lp.num_col_);

  HighsInt get_el = -1;
  for (HighsInt el = lp.a_matrix_.start_[Xcol];
       el < lp.a_matrix_.start_[Xcol + 1]; el++) {
    if (lp.a_matrix_.index_[el] == Xrow) {
      get_el = el;
      break;
    }
  }
  if (get_el < 0) {
    *val = 0;
  } else {
    *val = lp.a_matrix_.value_[get_el];
  }
}